

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node48.cpp
# Opt level: O3

void duckdb::Node48::DeleteChild(ART *art,Node *node,uint8_t byte)

{
  data_t dVar1;
  _Head_base<0UL,_duckdb::FixedSizeAllocator_*,_false> _Var2;
  idx_t iVar3;
  long lVar4;
  type paVar5;
  iterator iVar6;
  pointer this;
  data_ptr_t pdVar7;
  undefined7 in_register_00000011;
  ulong uVar8;
  long lVar9;
  Node node48;
  IndexPointer local_38;
  
  uVar8 = (node->super_IndexPointer).data;
  paVar5 = shared_ptr<std::array<duckdb::unique_ptr<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>,_false>,_9UL>,_true>
           ::operator*(&art->allocators);
  _Var2._M_head_impl =
       paVar5->_M_elems[4].
       super_unique_ptr<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>_>
       ._M_t.
       super___uniq_ptr_impl<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::FixedSizeAllocator_*,_std::default_delete<duckdb::FixedSizeAllocator>_>
       .super__Head_base<0UL,_duckdb::FixedSizeAllocator_*,_false>._M_head_impl;
  local_38.data = uVar8 & 0xffffffff;
  iVar6 = ::std::
          _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>_>,_std::allocator<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(&((_Var2._M_head_impl)->buffers)._M_h,&local_38.data);
  this = unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>::
         operator->((unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>
                     *)((long)iVar6.
                              super__Node_iterator_base<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>_>,_false>
                              ._M_cur + 0x10));
  pdVar7 = FixedSizeBuffer::Get(this,true);
  lVar9 = (ulong)((uint)(uVar8 >> 0x20) & 0xffffff) * (_Var2._M_head_impl)->segment_size;
  iVar3 = (_Var2._M_head_impl)->bitmask_offset;
  lVar4 = iVar3 + lVar9;
  uVar8 = CONCAT71(in_register_00000011,byte) & 0xffffffff;
  Node::Free(art,(Node *)(pdVar7 + (ulong)pdVar7[uVar8 + 1 + lVar4] * 8 + 0x108 + lVar4));
  pdVar7[uVar8 + 1 + lVar4] = '0';
  dVar1 = pdVar7[iVar3 + lVar9];
  pdVar7[iVar3 + lVar9] = dVar1 - 1;
  if ((byte)(dVar1 - 1) < 0xc) {
    local_38.data = (node->super_IndexPointer).data;
    Node16::ShrinkNode48(art,node,(Node *)&local_38);
  }
  return;
}

Assistant:

void Node48::DeleteChild(ART &art, Node &node, const uint8_t byte) {
	auto &n48 = Node::Ref<Node48>(art, node, NODE_48);

	// Free the child and decrease the count.
	Node::Free(art, n48.children[n48.child_index[byte]]);
	n48.child_index[byte] = EMPTY_MARKER;
	n48.count--;

	// Shrink to Node16.
	if (n48.count < SHRINK_THRESHOLD) {
		auto node48 = node;
		Node16::ShrinkNode48(art, node, node48);
	}
}